

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::TestSpecParser::addNamePattern(TestSpecParser *this)

{
  string token;
  unique_ptr<Catch::TestSpec::NamePattern> local_38;
  string local_30;
  
  preprocessPattern_abi_cxx11_(&local_30,this);
  if (local_30._M_string_length != 0) {
    if (this->m_exclusion == true) {
      Detail::make_unique<Catch::TestSpec::NamePattern,std::__cxx11::string&,std::__cxx11::string&>
                ((Detail *)&local_38,&local_30,&this->m_substring);
      std::
      vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>>>
      ::emplace_back<Catch::Detail::unique_ptr<Catch::TestSpec::NamePattern>>
                ((vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>>>
                  *)&(this->m_currentFilter).m_forbidden,&local_38);
    }
    else {
      Detail::make_unique<Catch::TestSpec::NamePattern,std::__cxx11::string&,std::__cxx11::string&>
                ((Detail *)&local_38,&local_30,&this->m_substring);
      std::
      vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>>>
      ::emplace_back<Catch::Detail::unique_ptr<Catch::TestSpec::NamePattern>>
                ((vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>>>
                  *)&this->m_currentFilter,&local_38);
    }
    if (local_38.m_ptr != (NamePattern *)0x0) {
      (*((local_38.m_ptr)->super_Pattern)._vptr_Pattern[1])();
    }
  }
  (this->m_substring)._M_string_length = 0;
  *(this->m_substring)._M_dataplus._M_p = '\0';
  this->m_exclusion = false;
  this->m_mode = None;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TestSpecParser::addNamePattern() {
        auto token = preprocessPattern();

        if (!token.empty()) {
            if (m_exclusion) {
                m_currentFilter.m_forbidden.emplace_back(Detail::make_unique<TestSpec::NamePattern>(token, m_substring));
            } else {
                m_currentFilter.m_required.emplace_back(Detail::make_unique<TestSpec::NamePattern>(token, m_substring));
            }
        }
        m_substring.clear();
        m_exclusion = false;
        m_mode = None;
    }